

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *data_00;
  byte bVar1;
  curl_socket_t cVar2;
  connectdata *pcVar3;
  TELNET *pTVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char cVar7;
  int iVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  TELNET *pTVar11;
  char *pcVar12;
  curl_slist *pcVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  curl_slist *pcVar17;
  size_t sVar18;
  timediff_t tVar19;
  byte *pbVar20;
  TELNET *pTVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  uint nfds;
  bool bVar26;
  curltime cVar27;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  char buffer [4096];
  uint local_109c;
  char *local_1088;
  ssize_t local_1080;
  ulong local_1078;
  uchar **local_1070;
  pollfd local_1068;
  int local_1060;
  undefined2 local_105c;
  ushort local_105a;
  long local_1058;
  uchar *local_1050;
  long local_1048;
  long local_1040;
  char *local_1038 [513];
  
  pcVar3 = data->conn;
  cVar2 = pcVar3->sock[0];
  *done = true;
  pTVar11 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar11 == (TELNET *)0x0) {
LAB_00158acc:
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_dyn_init(&pTVar11->out,0xffff);
    (data->req).p.telnet = pTVar11;
    pTVar11->telrcv_state = CURL_TS_DATA;
    pTVar11->subpointer = pTVar11->subbuffer;
    pTVar11->us_preferred[3] = 1;
    pTVar11->him_preferred[3] = 1;
    pTVar11->us_preferred[0] = 1;
    pTVar11->him_preferred[0] = 1;
    pTVar11->him_preferred[1] = 1;
    pTVar11->subnegotiation[0x1f] = 1;
    pTVar11 = (data->req).p.telnet;
    if ((data->state).aptr.user != (char *)0x0) {
      pcVar12 = data->conn->user;
      do {
        cVar7 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while ('\0' < cVar7);
      if (cVar7 != '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      curl_msnprintf((char *)local_1038,0x100,"USER,%s");
      pcVar13 = curl_slist_append(pTVar11->telnet_vars,(char *)local_1038);
      if (pcVar13 == (curl_slist *)0x0) {
        curl_slist_free_all(pTVar11->telnet_vars);
        pTVar11->telnet_vars = (curl_slist *)0x0;
        goto LAB_00158acc;
      }
      pTVar11->telnet_vars = pcVar13;
      pTVar11->us_preferred[0x27] = 1;
    }
    pcVar13 = (data->set).telnet_options;
    local_1068.fd = cVar2;
    if (pcVar13 != (curl_slist *)0x0) {
      local_1058 = CONCAT44(local_1058._4_4_,cVar2);
      local_1088 = "Syntax error in telnet option: %s";
      do {
        pcVar12 = pcVar13->data;
        pcVar14 = strchr(pcVar12,0x3d);
        if (pcVar14 == (char *)0x0) {
          CVar9 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_00158a84:
          Curl_failf(data,local_1088,pcVar12);
          goto LAB_00158adb;
        }
        data_00 = pcVar14 + 1;
        pcVar22 = data_00;
        do {
          cVar7 = *pcVar22;
          pcVar22 = pcVar22 + 1;
        } while ('\0' < cVar7);
        CVar9 = CURLE_OK;
        if (cVar7 == '\0') {
          switch((long)pcVar14 - (long)pcVar12) {
          case 2:
            iVar8 = curl_strnequal(pcVar12,"WS",2);
            if (iVar8 == 0) {
LAB_00158ad6:
              CVar9 = CURLE_UNKNOWN_OPTION;
              goto LAB_00158adb;
            }
            uVar15 = strtoul(data_00,local_1038,10);
            pcVar12 = local_1038[0];
            if ((uVar15 - 1 < 0xffff) && (cVar7 = Curl_raw_tolower(*local_1038[0]), cVar7 == 'x')) {
              uVar16 = strtoul(pcVar12 + 1,(char **)0x0,10);
              if (uVar16 - 1 < 0xffff) {
                pTVar11->subopt_wsx = (unsigned_short)uVar15;
                pTVar11->subopt_wsy = (unsigned_short)uVar16;
                pTVar11->us_preferred[0x1f] = 1;
                CVar9 = CURLE_OK;
              }
              else {
                CVar9 = CURLE_OK;
                if (uVar16 == 0) goto LAB_001589f2;
              }
            }
            else {
LAB_001589f2:
              Curl_failf(data,"Syntax error in telnet option: %s",pcVar13->data);
              CVar9 = CURLE_SETOPT_OPTION_SYNTAX;
            }
            break;
          default:
            local_1088 = "Unknown telnet option %s";
            CVar9 = CURLE_UNKNOWN_OPTION;
            goto LAB_00158a84;
          case 5:
            iVar8 = curl_strnequal(pcVar12,"TTYPE",5);
            if (iVar8 == 0) goto LAB_00158ad6;
            pTVar11->subopt_ttype = data_00;
            pTVar11->us_preferred[0x18] = 1;
            break;
          case 6:
            iVar8 = curl_strnequal(pcVar12,"BINARY",6);
            if (iVar8 == 0) goto LAB_00158ad6;
            iVar8 = atoi(data_00);
            if (iVar8 != 1) {
              CVar9 = CURLE_OK;
              pTVar11->us_preferred[0] = 0;
              pTVar11->him_preferred[0] = 0;
            }
            break;
          case 7:
            iVar8 = curl_strnequal(pcVar12,"NEW_ENV",7);
            if (iVar8 == 0) goto LAB_00158ad6;
            pcVar17 = curl_slist_append(pTVar11->telnet_vars,data_00);
            if (pcVar17 == (curl_slist *)0x0) {
              CVar9 = CURLE_OUT_OF_MEMORY;
              goto LAB_00158adb;
            }
            pTVar11->telnet_vars = pcVar17;
            pTVar11->us_preferred[0x27] = 1;
            break;
          case 8:
            iVar8 = curl_strnequal(pcVar12,"XDISPLOC",8);
            if (iVar8 == 0) goto LAB_00158ad6;
            pTVar11->subopt_xdisploc = data_00;
            pTVar11->us_preferred[0x23] = 1;
          }
        }
      } while ((CVar9 == CURLE_OK) && (pcVar13 = pcVar13->next, pcVar13 != (curl_slist *)0x0));
      local_1068.fd = (curl_socket_t)local_1058;
      if (CVar9 != CURLE_OK) {
LAB_00158adb:
        curl_slist_free_all(pTVar11->telnet_vars);
        pTVar11->telnet_vars = (curl_slist *)0x0;
        return CVar9;
      }
    }
    local_1068.events = 1;
    uVar15 = *(ulong *)&(data->set).field_0x8ca;
    bVar26 = true;
    if ((uVar15 & 2) == 0) {
      local_1060 = fileno((FILE *)(data->state).in);
      local_105c = 1;
      local_1088 = (char *)0x3e8;
      nfds = 2;
      if (local_1060 < 0) {
        bVar26 = false;
        Curl_failf(data,"cannot read input");
        CVar9 = CURLE_RECV_ERROR;
      }
      else {
        CVar9 = CURLE_OK;
      }
    }
    else {
      local_1088 = (char *)0x64;
      nfds = 1;
      CVar9 = CURLE_OK;
    }
    local_1058 = 0;
    local_1048 = 0;
    do {
      if (!bVar26) goto LAB_001594b6;
      iVar8 = Curl_poll(&local_1068,nfds,(timediff_t)local_1088);
      if (iVar8 == 0) {
        local_1068.revents = 0;
        local_105a = 0;
LAB_00158b94:
        local_1080 = 0;
        if ((uVar15 & 2) == 0) {
          if ((local_105a & 1) != 0) {
            local_1080 = read(local_1060,local_1038,0x1000);
LAB_00158c1d:
            if (0 < local_1080) {
              CVar10 = send_telnet_data(data,(char *)local_1038,local_1080);
              CVar9 = CURLE_OK;
              if (CVar10 == CURLE_OK) {
                local_1058 = local_1058 + local_1080;
                Curl_pgrsSetUploadCounter(data,local_1058);
                goto LAB_00158c8c;
              }
              bVar26 = false;
              CVar9 = CVar10;
              goto LAB_00158c8f;
            }
          }
          bVar26 = local_1080 == 0;
        }
        else {
          sVar18 = (*(data->state).fread_func)((char *)local_1038,1,0x1000,(data->state).in);
          iVar8 = (int)sVar18;
          local_1080 = (ssize_t)iVar8;
          if (iVar8 == 0x10000000) {
LAB_00158c71:
            bVar26 = false;
          }
          else {
            if (iVar8 != 0x10000001) goto LAB_00158c1d;
LAB_00158c8c:
            bVar26 = true;
          }
        }
      }
      else {
        if (iVar8 == -1) goto LAB_001594b6;
        if ((local_1068.revents & 1U) == 0) goto LAB_00158b94;
        CVar9 = Curl_xfer_recv(data,(char *)local_1038,0x1000,&local_1080);
        if (CVar9 == CURLE_OK) {
          if (local_1080 < 1) {
            bVar26 = false;
            CVar9 = CURLE_OK;
            goto LAB_00158c8f;
          }
          local_1048 = local_1048 + local_1080;
          CVar9 = Curl_pgrsSetDownloadCounter(data,local_1048);
          if (CVar9 == CURLE_OK) {
            local_1078 = uVar15;
            if (local_1080 != 0) {
              pTVar4 = (data->req).p.telnet;
              local_1070 = &pTVar4->subpointer;
              local_1050 = pTVar4->subbuffer;
              local_109c = 0xffffffff;
              lVar25 = 0;
              local_1040 = local_1080;
              lVar23 = local_1080;
              do {
                if (CURL_TS_SE < pTVar4->telrcv_state) goto LAB_00159428;
                bVar1 = *(byte *)((long)local_1038 + lVar25);
                uVar24 = (uint)lVar25;
                switch(pTVar4->telrcv_state) {
                case CURL_TS_DATA:
                  if (bVar1 == 0xd) {
                    pTVar4->telrcv_state = CURL_TS_CR;
                  }
                  else if (bVar1 == 0xff) {
                    pTVar4->telrcv_state = CURL_TS_IAC;
                    if ((int)local_109c < 0) goto LAB_00158fc0;
LAB_00158d9a:
                    CVar9 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_109c),
                                              (long)(int)(uVar24 - local_109c));
                    local_109c = 0xffffffff;
                    if (CVar9 == CURLE_OK) break;
                    goto LAB_0015945c;
                  }
                  if ((int)local_109c < 0) {
                    local_109c = uVar24;
                  }
                  break;
                case CURL_TS_IAC:
switchD_00158d65_caseD_1:
                  switch(bVar1) {
                  case 0xfa:
                    pTVar4->subpointer = local_1050;
LAB_00159138:
                    pTVar4->telrcv_state = CURL_TS_SB;
                    break;
                  case 0xfb:
                    pTVar4->telrcv_state = CURL_TS_WILL;
                    break;
                  case 0xfc:
                    pTVar4->telrcv_state = CURL_TS_WONT;
                    break;
                  case 0xfd:
                    pTVar4->telrcv_state = CURL_TS_DO;
                    break;
                  case 0xfe:
                    pTVar4->telrcv_state = CURL_TS_DONT;
                    break;
                  case 0xff:
                    pTVar4->telrcv_state = CURL_TS_DATA;
LAB_001592e4:
                    if ((int)local_109c < 0) {
                      local_109c = uVar24;
                    }
                    break;
                  default:
                    pTVar4->telrcv_state = CURL_TS_DATA;
                    printoption(data,"RCVD",0xff,(uint)bVar1);
                  }
                  break;
                case CURL_TS_WILL:
                  printoption(data,"RCVD",0xfb,(uint)bVar1);
                  pTVar4->please_negotiate = 1;
                  pTVar21 = (data->req).p.telnet;
                  iVar8 = pTVar21->him[bVar1];
                  if (iVar8 == 3) {
                    iVar8 = pTVar21->himq[bVar1];
                    if (iVar8 != 1) goto LAB_00159233;
                    pTVar21->him[bVar1] = 1;
                    pTVar21->himq[bVar1] = 0;
                  }
                  else if (iVar8 == 2) {
                    if (pTVar21->himq[bVar1] == 1) {
                      pTVar21->him[bVar1] = 3;
                      pTVar21->himq[bVar1] = 0;
                      goto LAB_001593c4;
                    }
                    if (pTVar21->himq[bVar1] == 0) {
                      pTVar21->him[bVar1] = 1;
                    }
                  }
                  else if (iVar8 == 0) {
                    if (pTVar21->him_preferred[bVar1] == 1) {
                      pTVar21->him[bVar1] = 1;
                      goto LAB_001593e7;
                    }
LAB_001593c4:
                    iVar8 = 0xfe;
                    goto LAB_00159410;
                  }
                  goto LAB_00159418;
                case CURL_TS_WONT:
                  printoption(data,"RCVD",0xfc,(uint)bVar1);
                  pTVar4->please_negotiate = 1;
                  pTVar21 = (data->req).p.telnet;
                  iVar8 = pTVar21->him[bVar1];
                  if (iVar8 == 3) {
                    iVar8 = pTVar21->himq[bVar1];
                    if (iVar8 == 1) {
                      pTVar21->him[bVar1] = 2;
                      pTVar21->himq[bVar1] = 0;
LAB_001593e7:
                      iVar8 = 0xfd;
                      goto LAB_00159410;
                    }
LAB_00159233:
                    if (iVar8 == 0) {
                      pTVar21->him[bVar1] = 0;
                    }
                  }
                  else if (iVar8 == 2) {
                    iVar8 = pTVar21->himq[bVar1];
                    if (iVar8 != 1) goto LAB_00159233;
                    pTVar21->him[bVar1] = 0;
                    pTVar21->himq[bVar1] = 0;
                  }
                  else if (iVar8 == 1) {
                    pTVar21->him[bVar1] = 0;
                    goto LAB_001593c4;
                  }
                  goto LAB_00159418;
                case CURL_TS_DO:
                  printoption(data,"RCVD",0xfd,(uint)bVar1);
                  pTVar4->please_negotiate = 1;
                  pTVar21 = (data->req).p.telnet;
                  iVar8 = pTVar21->us[bVar1];
                  if (iVar8 == 3) {
                    if (pTVar21->usq[bVar1] == 1) {
                      pTVar21->us[bVar1] = 1;
                      pTVar21->usq[bVar1] = 0;
                    }
                    else if (pTVar21->usq[bVar1] == 0) {
                      pTVar21->us[bVar1] = 0;
                    }
                  }
                  else if (iVar8 == 2) {
                    if (pTVar21->usq[bVar1] == 1) {
                      pTVar21->us[bVar1] = 3;
                      pTVar21->himq[bVar1] = 0;
LAB_0015936d:
                      send_negotiation(data,0xfc,(uint)bVar1);
                    }
                    else if (pTVar21->usq[bVar1] == 0) {
                      pTVar21->us[bVar1] = 1;
                      goto LAB_0015916b;
                    }
                  }
                  else if (iVar8 == 0) {
                    if (pTVar21->us_preferred[bVar1] == 1) {
                      pTVar21->us[bVar1] = 1;
                      send_negotiation(data,0xfb,(uint)bVar1);
LAB_0015916b:
                      if (pTVar21->subnegotiation[bVar1] != 1) goto LAB_00159395;
                    }
                    else {
                      if (pTVar21->subnegotiation[bVar1] != 1) goto LAB_0015936d;
                      pTVar21->us[bVar1] = 1;
                      send_negotiation(data,0xfb,(uint)bVar1);
                    }
                    sendsuboption(data,(uint)bVar1);
                  }
LAB_00159395:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                  lVar23 = local_1040;
                  break;
                case CURL_TS_DONT:
                  printoption(data,"RCVD",0xfe,(uint)bVar1);
                  pTVar4->please_negotiate = 1;
                  pTVar21 = (data->req).p.telnet;
                  iVar8 = pTVar21->us[bVar1];
                  if (iVar8 == 3) {
                    iVar8 = pTVar21->usq[bVar1];
                    if (iVar8 == 1) {
                      pTVar21->us[bVar1] = 2;
                      pTVar21->usq[bVar1] = 0;
                      iVar8 = 0xfb;
LAB_00159410:
                      send_negotiation(data,iVar8,(uint)bVar1);
                    }
                    else {
LAB_0015927e:
                      if (iVar8 == 0) {
                        pTVar21->us[bVar1] = 0;
                      }
                    }
                  }
                  else if (iVar8 == 2) {
                    iVar8 = pTVar21->usq[bVar1];
                    if (iVar8 != 1) goto LAB_0015927e;
                    pTVar21->us[bVar1] = 0;
                    pTVar21->usq[bVar1] = 0;
                  }
                  else if (iVar8 == 1) {
                    pTVar21->us[bVar1] = 0;
                    iVar8 = 0xfc;
                    goto LAB_00159410;
                  }
LAB_00159418:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                  break;
                case CURL_TS_CR:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                  if (bVar1 != 0) goto LAB_001592e4;
                  if (-1 < (int)local_109c) goto LAB_00158d9a;
LAB_00158fc0:
                  local_109c = 0xffffffff;
                  break;
                case CURL_TS_SB:
                  if (bVar1 == 0xff) {
                    pTVar4->telrcv_state = CURL_TS_SE;
                  }
                  else {
                    pbVar20 = *local_1070;
                    if (pbVar20 < local_1070) {
                      *local_1070 = pbVar20 + 1;
                      *pbVar20 = bVar1;
                    }
                  }
                  break;
                case CURL_TS_SE:
                  pbVar20 = *local_1070;
                  if (bVar1 != 0xf0) {
                    if (bVar1 != 0xff) {
                      if (pbVar20 < local_1070) {
                        *local_1070 = pbVar20 + 1;
                        *pbVar20 = 0xff;
                        pbVar20 = *local_1070;
                      }
                      if (pbVar20 < local_1070) {
                        *local_1070 = pbVar20 + 1;
                        *pbVar20 = bVar1;
                        pbVar20 = *local_1070;
                      }
                      pTVar4->subend = pbVar20 + -2;
                      pTVar4->subpointer = local_1050;
                      printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar1);
                      suboption(data);
                      pTVar4->telrcv_state = CURL_TS_IAC;
                      goto switchD_00158d65_caseD_1;
                    }
                    if (pbVar20 < local_1070) {
                      *local_1070 = pbVar20 + 1;
                      *pbVar20 = 0xff;
                    }
                    goto LAB_00159138;
                  }
                  if (pbVar20 < local_1070) {
                    *local_1070 = pbVar20 + 1;
                    *pbVar20 = 0xff;
                    pbVar20 = *local_1070;
                  }
                  if (pbVar20 < local_1070) {
                    *local_1070 = pbVar20 + 1;
                    *pbVar20 = 0xf0;
                    pbVar20 = *local_1070;
                  }
                  pTVar4->subend = pbVar20 + -2;
                  pTVar4->subpointer = local_1050;
                  suboption(data);
                  pTVar4->telrcv_state = CURL_TS_DATA;
                }
LAB_00159428:
                lVar25 = lVar25 + 1;
              } while (lVar23 != lVar25);
              if ((-1 < (int)local_109c) &&
                 (CVar9 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_109c),
                                            (long)(int)((int)lVar23 - local_109c)),
                 CVar9 != CURLE_OK)) {
LAB_0015945c:
                bVar26 = false;
                uVar15 = local_1078;
                goto LAB_00158c8f;
              }
            }
            uVar15 = local_1078;
            CVar9 = CURLE_OK;
            if ((pTVar11->please_negotiate != 0) && (pTVar11->already_negotiated == 0)) {
              negotiate(data);
              pTVar11->already_negotiated = 1;
            }
            goto LAB_00158b94;
          }
          goto LAB_00158c71;
        }
        bVar26 = true;
        if (CVar9 != CURLE_AGAIN) goto LAB_00158c71;
      }
LAB_00158c8f:
      if ((data->set).timeout != 0) {
        cVar27 = Curl_now();
        uVar5 = (pcVar3->created).tv_sec;
        uVar6 = (pcVar3->created).tv_usec;
        older.tv_usec = uVar6;
        older.tv_sec = uVar5;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar27._0_12_,0);
        newer.tv_usec = SUB124(cVar27._0_12_,8);
        older._12_4_ = 0;
        tVar19 = Curl_timediff(newer,older);
        if ((long)(ulong)(data->set).timeout <= tVar19) {
          bVar26 = false;
          Curl_failf(data,"Time-out");
          CVar9 = CURLE_OPERATION_TIMEDOUT;
        }
      }
      iVar8 = Curl_pgrsUpdate(data);
    } while (iVar8 == 0);
    CVar9 = CURLE_ABORTED_BY_CALLBACK;
LAB_001594b6:
    Curl_xfer_setup_nop(data);
  }
  return CVar9;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* TODO: in test 1452, macOS sees a ECONNRESET sometimes?
           * Is this the telnet test server not shutting down the socket
           * in a clean way? Seems to be timing related, happens more
           * on slow debug build */
          if(data->state.os_errno == ECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}